

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zonemeta.cpp
# Opt level: O0

UChar * icu_63::ZoneMeta::getCanonicalCLDRID(TimeZone *tz)

{
  UnicodeString *tzid;
  long local_88;
  undefined1 local_68 [8];
  UnicodeString tzID;
  UErrorCode status;
  OlsonTimeZone *otz;
  TimeZone *tz_local;
  
  if (tz == (TimeZone *)0x0) {
    local_88 = 0;
  }
  else {
    local_88 = __dynamic_cast(tz,&TimeZone::typeinfo,&OlsonTimeZone::typeinfo,0);
  }
  if (local_88 == 0) {
    tzID.fUnion._52_4_ = 0;
    UnicodeString::UnicodeString((UnicodeString *)local_68);
    tzid = TimeZone::getID(tz,(UnicodeString *)local_68);
    tz_local = (TimeZone *)
               getCanonicalCLDRID(tzid,(UErrorCode *)(tzID.fUnion.fStackFields.fBuffer + 0x19));
    UnicodeString::~UnicodeString((UnicodeString *)local_68);
  }
  else {
    tz_local = (TimeZone *)OlsonTimeZone::getCanonicalID((OlsonTimeZone *)tz);
  }
  return (UChar *)tz_local;
}

Assistant:

const UChar* U_EXPORT2
ZoneMeta::getCanonicalCLDRID(const TimeZone& tz) {
    if (dynamic_cast<const OlsonTimeZone *>(&tz) != NULL) {
        // short cut for OlsonTimeZone
        const OlsonTimeZone *otz = (const OlsonTimeZone*)&tz;
        return otz->getCanonicalID();
    }
    UErrorCode status = U_ZERO_ERROR;
    UnicodeString tzID;
    return getCanonicalCLDRID(tz.getID(tzID), status);
}